

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O0

btree_result btree_get_key_range(btree *btree,idx_t num,idx_t den,void *key_begin,void *key_end)

{
  uint16_t uVar1;
  ushort uVar2;
  btree_print_func *pbVar3;
  _func_voidref_void_ptr_bid_t *p_Var4;
  void *pvVar5;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var6;
  _func_bid_t_void_ptr *p_Var7;
  long lVar8;
  long lVar9;
  uint64_t uVar10;
  uint8_t *puVar11;
  btree *pbVar12;
  idx_t iVar13;
  uint uVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  bnode *pbVar17;
  bid_t bVar18;
  uint uVar19;
  uint8_t auStack_c0 [8];
  uint8_t auStack_b8 [8];
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *local_b0;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *local_a8;
  ulong local_a0;
  uint64_t _idx_end;
  uint64_t _idx_begin;
  uint64_t mask;
  uint64_t resolution;
  uint64_t _nentry;
  uint64_t _den;
  uint64_t _num;
  bnode *node;
  bnode *root;
  bid_t bid;
  idx_t idx;
  idx_t idx_end;
  uint8_t *puStack_48;
  idx_t idx_begin;
  uint8_t *v;
  uint8_t *k;
  void *addr;
  void *key_end_local;
  void *key_begin_local;
  idx_t den_local;
  btree *pbStack_18;
  idx_t num_local;
  btree *btree_local;
  
  lVar8 = -(ulong)(btree->ksize + 0xf & 0xfffffff0);
  puVar16 = auStack_b8 + lVar8;
  lVar9 = -(ulong)(btree->vsize + 0xf & 0xfffffff0);
  puVar15 = puVar16 + lVar9;
  if (num < den) {
    mask = 0x10;
    _idx_begin = 0xf;
    puStack_48 = puVar15;
    v = puVar16;
    addr = key_end;
    key_end_local = key_begin;
    key_begin_local._4_2_ = den;
    key_begin_local._6_2_ = num;
    pbStack_18 = btree;
    if (btree->kv_ops->init_kv_var != (btree_print_func *)0x0) {
      pbVar3 = btree->kv_ops->init_kv_var;
      puVar15[-8] = 0xa6;
      puVar15[-7] = 0xbb;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      (*pbVar3)(btree,puVar16,puVar15);
    }
    _den = key_begin_local._6_2_ * mask;
    _nentry = key_begin_local._4_2_ * mask;
    p_Var4 = pbStack_18->blk_ops->blk_read;
    pvVar5 = pbStack_18->blk_handle;
    bVar18 = pbStack_18->root_bid;
    builtin_memcpy(auStack_b8 + lVar9 + lVar8 + -8,"޻\x11",4);
    puVar15[-4] = '\0';
    puVar15[-3] = '\0';
    puVar15[-2] = '\0';
    puVar15[-1] = '\0';
    puVar16 = (uint8_t *)(*p_Var4)(pvVar5,bVar18);
    pbVar12 = pbStack_18;
    uVar1 = pbStack_18->height;
    k = puVar16;
    puVar15[-8] = 0xf7;
    puVar15[-7] = 0xbb;
    puVar15[-6] = '\x11';
    puVar15[-5] = '\0';
    puVar15[-4] = '\0';
    puVar15[-3] = '\0';
    puVar15[-2] = '\0';
    puVar15[-1] = '\0';
    pbVar17 = _fetch_bnode(pbVar12,puVar16,uVar1);
    pvVar5 = key_end_local;
    puVar11 = v;
    puVar16 = puStack_48;
    resolution = pbVar17->nentry * mask;
    node = pbVar17;
    if (pbStack_18->height == 1) {
      p_Var6 = pbStack_18->kv_ops->get_kv;
      uVar14 = (uint)key_begin_local._6_2_;
      uVar2 = pbVar17->nentry;
      uVar19 = (uint)key_begin_local._4_2_;
      local_b0 = p_Var6;
      puVar15[-8] = 'f';
      puVar15[-7] = 0xbc;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      (*p_Var6)(pbVar17,(idx_t)((int)(uVar14 * uVar2) / (int)uVar19),pvVar5,(void *)0x0);
      pvVar5 = addr;
      pbVar17 = node;
      p_Var6 = pbStack_18->kv_ops->get_kv;
      uVar14 = (uint)key_begin_local._6_2_;
      uVar2 = node->nentry;
      uVar19 = (uint)key_begin_local._4_2_;
      local_a8 = p_Var6;
      puVar15[-8] = 0xaf;
      puVar15[-7] = 0xbc;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      (*p_Var6)(pbVar17,(short)((int)((uVar14 + 1) * (uint)uVar2) / (int)uVar19) - 1,pvVar5,
                (void *)0x0);
    }
    else {
      _idx_end = (_den * resolution) / _nentry;
      local_a0 = ((_den + mask) * resolution) / _nentry - 1;
      iVar13 = (idx_t)(_idx_end / mask);
      bid._4_2_ = (ushort)(local_a0 / mask);
      if (pbVar17->nentry <= bid._4_2_) {
        bid._4_2_ = pbVar17->nentry - 1;
      }
      p_Var6 = pbStack_18->kv_ops->get_kv;
      bid._6_2_ = iVar13;
      puVar15[-8] = 'Q';
      puVar15[-7] = 0xbd;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      (*p_Var6)(pbVar17,iVar13,puVar11,puVar16);
      puVar16 = puStack_48;
      p_Var7 = pbStack_18->kv_ops->value2bid;
      puVar15[-8] = 'c';
      puVar15[-7] = 0xbd;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      bVar18 = (*p_Var7)(puVar16);
      pbVar17 = (bnode *)(bVar18 >> 0x38 | (bVar18 & 0xff000000000000) >> 0x28 |
                          (bVar18 & 0xff0000000000) >> 0x18 | (bVar18 & 0xff00000000) >> 8 |
                          (bVar18 & 0xff000000) << 8 | (bVar18 & 0xff0000) << 0x18 |
                          (bVar18 & 0xff00) << 0x28 | bVar18 << 0x38);
      p_Var4 = pbStack_18->blk_ops->blk_read;
      pvVar5 = pbStack_18->blk_handle;
      root = pbVar17;
      puVar15[-8] = '!';
      puVar15[-7] = 0xbe;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      puVar16 = (uint8_t *)(*p_Var4)(pvVar5,(bid_t)pbVar17);
      pbVar12 = pbStack_18;
      uVar1 = pbStack_18->height;
      k = puVar16;
      puVar15[-8] = '@';
      puVar15[-7] = 0xbe;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      pbVar17 = _fetch_bnode(pbVar12,puVar16,uVar1 - 1);
      pvVar5 = key_end_local;
      iVar13 = (idx_t)(((_idx_end & _idx_begin) * (long)(int)(pbVar17->nentry - 1)) / (mask - 1));
      p_Var6 = pbStack_18->kv_ops->get_kv;
      _num = (uint64_t)pbVar17;
      bid._2_2_ = iVar13;
      puVar15[-8] = 0x93;
      puVar15[-7] = 0xbe;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      (*p_Var6)(pbVar17,iVar13,pvVar5,(void *)0x0);
      puVar11 = v;
      puVar16 = puStack_48;
      iVar13 = bid._4_2_;
      pbVar17 = node;
      if (bid._4_2_ != bid._6_2_) {
        p_Var6 = pbStack_18->kv_ops->get_kv;
        builtin_memcpy(auStack_b8 + lVar9 + lVar8 + -8,"þ\x11",4);
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        (*p_Var6)(pbVar17,iVar13,puVar11,puVar16);
        puVar16 = puStack_48;
        p_Var7 = pbStack_18->kv_ops->value2bid;
        builtin_memcpy(auStack_b8 + lVar9 + lVar8 + -8,"վ\x11",4);
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        bVar18 = (*p_Var7)(puVar16);
        pbVar17 = (bnode *)(bVar18 >> 0x38 | (bVar18 & 0xff000000000000) >> 0x28 |
                            (bVar18 & 0xff0000000000) >> 0x18 | (bVar18 & 0xff00000000) >> 8 |
                            (bVar18 & 0xff000000) << 8 | (bVar18 & 0xff0000) << 0x18 |
                            (bVar18 & 0xff00) << 0x28 | bVar18 << 0x38);
        p_Var4 = pbStack_18->blk_ops->blk_read;
        pvVar5 = pbStack_18->blk_handle;
        root = pbVar17;
        puVar15[-8] = 0x93;
        puVar15[-7] = 0xbf;
        puVar15[-6] = '\x11';
        puVar15[-5] = '\0';
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        puVar16 = (uint8_t *)(*p_Var4)(pvVar5,(bid_t)pbVar17);
        pbVar12 = pbStack_18;
        uVar1 = pbStack_18->height;
        k = puVar16;
        puVar15[-8] = 0xb2;
        puVar15[-7] = 0xbf;
        puVar15[-6] = '\x11';
        puVar15[-5] = '\0';
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        _num = (uint64_t)_fetch_bnode(pbVar12,puVar16,uVar1 - 1);
      }
      pvVar5 = addr;
      uVar10 = _num;
      iVar13 = (idx_t)(((local_a0 & _idx_begin) * (long)(int)(*(ushort *)(_num + 6) - 1)) /
                      (mask - 1));
      p_Var6 = pbStack_18->kv_ops->get_kv;
      bid._2_2_ = iVar13;
      puVar15[-8] = '\x05';
      puVar15[-7] = 0xc0;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      (*p_Var6)((bnode *)uVar10,iVar13,pvVar5,(void *)0x0);
    }
    pbVar12 = pbStack_18;
    puVar11 = v;
    puVar16 = puStack_48;
    if (pbStack_18->kv_ops->free_kv_var != (btree_print_func *)0x0) {
      pbVar3 = pbStack_18->kv_ops->free_kv_var;
      puVar15[-8] = '.';
      puVar15[-7] = 0xc0;
      puVar15[-6] = '\x11';
      puVar15[-5] = '\0';
      puVar15[-4] = '\0';
      puVar15[-3] = '\0';
      puVar15[-2] = '\0';
      puVar15[-1] = '\0';
      (*pbVar3)(pbVar12,puVar11,puVar16);
    }
    btree_local._4_4_ = BTREE_RESULT_SUCCESS;
  }
  else {
    btree_local._4_4_ = BTREE_RESULT_FAIL;
  }
  return btree_local._4_4_;
}

Assistant:

btree_result btree_get_key_range(
    struct btree *btree, idx_t num, idx_t den, void *key_begin, void *key_end)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    idx_t idx_begin, idx_end, idx;
    bid_t bid;
    struct bnode *root, *node;
    uint64_t _num, _den, _nentry, resolution, mask, _idx_begin, _idx_end;

    if (num >= den) {
        // TODO: Need to log the corresponding error message
        return BTREE_RESULT_FAIL;
    }
    resolution = 1<<4; mask = resolution-1;

    if (btree->kv_ops->init_kv_var) btree->kv_ops->init_kv_var(btree, k, v);
    _num = (uint64_t)num * resolution;
    _den = (uint64_t)den * resolution;

    // get root node
    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    root = _fetch_bnode(btree, addr, btree->height);
    _nentry = (uint64_t)root->nentry * resolution;

    if (btree->height == 1) {
        btree->kv_ops->get_kv(root, ((num+0) * root->nentry / den)-0, key_begin, NULL);
        btree->kv_ops->get_kv(root, ((num+1) * root->nentry / den)-1, key_end, NULL);
    }else{
        _idx_begin = (_num * _nentry / _den);
        _idx_end = ((_num+resolution) * _nentry / _den)-1;

        idx_begin = _idx_begin / resolution;
        idx_end = (_idx_end / resolution);
        if (idx_end >= root->nentry) idx_end = root->nentry-1;

        // get first child node (for KEY_BEGIN)
        btree->kv_ops->get_kv(root, idx_begin, k, v);
        bid = btree->kv_ops->value2bid(v);
        bid = _endian_decode(bid);
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid);
        node = _fetch_bnode(btree, addr, btree->height-1);

        idx = ((_idx_begin & mask) * (node->nentry-1) / (resolution-1));
        btree->kv_ops->get_kv(node, idx, key_begin, NULL);

        // get second child node (for KEY_END)
        if (idx_end != idx_begin) {
            btree->kv_ops->get_kv(root, idx_end, k, v);
            bid = btree->kv_ops->value2bid(v);
            bid = _endian_decode(bid);
            addr = btree->blk_ops->blk_read(btree->blk_handle, bid);
            node = _fetch_bnode(btree, addr, btree->height-1);
        }

        idx = ((_idx_end & mask) * (node->nentry-1) / (resolution-1));
        btree->kv_ops->get_kv(node, idx, key_end, NULL);
    }

    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
    return BTREE_RESULT_SUCCESS;
}